

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool testing::internal::SkipPrefix(char *prefix,char **pstr)

{
  char *__s1;
  int iVar1;
  size_t __n;
  
  __n = strlen(prefix);
  __s1 = *pstr;
  iVar1 = strncmp(__s1,prefix,__n);
  if (iVar1 == 0) {
    *pstr = __s1 + __n;
  }
  return iVar1 == 0;
}

Assistant:

bool SkipPrefix(const char* prefix, const char** pstr) {
  const size_t prefix_len = strlen(prefix);
  if (strncmp(*pstr, prefix, prefix_len) == 0) {
    *pstr += prefix_len;
    return true;
  }
  return false;
}